

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::rc::TextureCube::updateView(TextureCube *this,DepthStencilMode mode)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ConstPixelBufferAccess *pCVar6;
  long lVar7;
  TextureLevelArray *this_00;
  int local_9c;
  ConstPixelBufferAccess *faces [6];
  TextureCubeView local_68;
  
  iVar1 = (this->super_Texture).m_baseLevel;
  faces[4] = (ConstPixelBufferAccess *)0x0;
  faces[5] = (ConstPixelBufferAccess *)0x0;
  faces[2] = (ConstPixelBufferAccess *)0x0;
  faces[3] = (ConstPixelBufferAccess *)0x0;
  faces[0] = (ConstPixelBufferAccess *)0x0;
  faces[1] = (ConstPixelBufferAccess *)0x0;
  bVar3 = isComplete(this);
  if (bVar3) {
    this_00 = this->m_levels;
    if ((this->super_Texture).m_sampler.minFilter < NEAREST_MIPMAP_NEAREST) {
      local_9c = 1;
    }
    else {
      uVar2 = this->m_levels[0].m_access[iVar1].super_ConstPixelBufferAccess.m_size.m_data[0];
      iVar4 = ((this->super_Texture).m_maxLevel - iVar1) + 1;
      uVar5 = 0x20;
      if (uVar2 != 0) {
        uVar5 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar5 = uVar5 ^ 0x1f;
      }
      local_9c = 0x20 - uVar5;
      if (iVar4 < (int)(0x20 - uVar5)) {
        local_9c = iVar4;
      }
    }
    pCVar6 = this->m_levels[0].m_effectiveAccess + iVar1;
    for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
      TextureLevelArray::updateSamplerMode(this_00,mode);
      faces[lVar7] = pCVar6;
      pCVar6 = (ConstPixelBufferAccess *)(pCVar6[0x21].m_pitch.m_data + 1);
      this_00 = this_00 + 1;
    }
  }
  else {
    local_9c = 0;
  }
  tcu::TextureCubeView::TextureCubeView(&local_68,local_9c,&faces);
  (this->m_view).m_levels[5] = local_68.m_levels[5];
  (this->m_view).m_levels[3] = local_68.m_levels[3];
  (this->m_view).m_levels[4] = local_68.m_levels[4];
  (this->m_view).m_levels[1] = local_68.m_levels[1];
  (this->m_view).m_levels[2] = local_68.m_levels[2];
  (this->m_view).m_numLevels = local_68.m_numLevels;
  *(undefined4 *)&(this->m_view).field_0x4 = local_68._4_4_;
  (this->m_view).m_levels[0] = local_68.m_levels[0];
  return;
}

Assistant:

void TextureCube::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int							baseLevel	= getBaseLevel();
	const tcu::ConstPixelBufferAccess*	faces[tcu::CUBEFACE_LAST];

	deMemset(&faces[0], 0, sizeof(faces));

	if (isComplete())
	{
		const int	size		= getFace(baseLevel, tcu::CUBEFACE_NEGATIVE_X).getWidth();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels1D(size)) : 1;

		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			m_levels[face].updateSamplerMode(mode);
			faces[face] = m_levels[face].getEffectiveLevels() + baseLevel;
		}

		m_view = tcu::TextureCubeView(numLevels, faces);
	}
	else
		m_view = tcu::TextureCubeView(0, faces);
}